

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

const_reference __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::operator[](basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
             *this,size_type idx)

{
  bool bVar1;
  reference pvVar2;
  domain_error *this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  local_58 [2];
  string local_38 [32];
  size_type local_18;
  size_type idx_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *this_local;
  
  local_18 = idx;
  idx_local = (size_type)this;
  bVar1 = is_array(this);
  if (!bVar1) {
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    type_name(local_58);
    std::operator+((char *)local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "cannot use operator[] with ");
    std::domain_error::domain_error(this_00,local_38);
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  if ((this->m_value).object != (object_t *)0x0) {
    pvVar2 = std::
             vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
             ::operator[]((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                           *)(this->m_value).object,local_18);
    return pvVar2;
  }
  __assert_fail("m_value.array != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                ,0xd0b,
                "const_reference nlohmann::basic_json<>::operator[](size_type) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
               );
}

Assistant:

const_reference operator[](size_type idx) const
        {
            // const operator[] only works for arrays
            if (is_array())
            {
                assert(m_value.array != nullptr);
                return m_value.array->operator[](idx);
            }
            else
            {
                throw std::domain_error("cannot use operator[] with " + type_name());
            }
        }